

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLSLMaterialRenderer::COpenGLSLMaterialRenderer
          (COpenGLSLMaterialRenderer *this,COpenGLDriver *driver,s32 *outMaterialTypeNr,
          c8 *vertexShaderProgram,c8 *vertexShaderEntryPointName,
          E_VERTEX_SHADER_TYPE vsCompileTarget,c8 *pixelShaderProgram,c8 *pixelShaderEntryPointName,
          E_PIXEL_SHADER_TYPE psCompileTarget,c8 *geometryShaderProgram,
          c8 *geometryShaderEntryPointName,E_GEOMETRY_SHADER_TYPE gsCompileTarget,
          E_PRIMITIVE_TYPE inType,E_PRIMITIVE_TYPE outType,u32 verticesOut,
          IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,s32 userData)

{
  int iVar1;
  
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined4 *)&this->field_0x68 = 1;
  (this->super_IMaterialRenderer)._vptr_IMaterialRenderer = (_func_int **)0x267fe8;
  *(undefined8 *)&this->field_0x58 = 0x268100;
  *(undefined8 *)&(this->super_IMaterialRenderer).field_0x8 = 0x268088;
  *(COpenGLDriver **)&(this->super_IMaterialRenderer).field_0x10 = driver;
  *(IShaderConstantSetCallBack **)&(this->super_IMaterialRenderer).field_0x18 = callback;
  this->Alpha = false;
  this->Blending = false;
  this->AlphaTest = false;
  this->Program = 0;
  this->Program2 = 0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UniformInfo).is_sorted = true;
  this->UserData = userData;
  switch(baseMaterial) {
  case EMT_TRANSPARENT_ALPHA_CHANNEL:
  case EMT_TRANSPARENT_VERTEX_ALPHA:
    this->Alpha = true;
    break;
  case EMT_TRANSPARENT_ALPHA_CHANNEL_REF:
    this->AlphaTest = true;
    break;
  case EMT_ONETEXTURE_BLEND:
    this->Blending = true;
  }
  if (callback != (IShaderConstantSetCallBack *)0x0) {
    *(int *)(&callback->field_0x10 + (long)callback->_vptr_IShaderConstantSetCallBack[-3]) =
         *(int *)(&callback->field_0x10 + (long)callback->_vptr_IShaderConstantSetCallBack[-3]) + 1;
  }
  iVar1 = (*(driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(driver,0x12);
  if ((char)iVar1 != '\0') {
    init(this,(EVP_PKEY_CTX *)outMaterialTypeNr);
  }
  return;
}

Assistant:

COpenGLSLMaterialRenderer::COpenGLSLMaterialRenderer(video::COpenGLDriver *driver,
		s32 &outMaterialTypeNr, const c8 *vertexShaderProgram,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const c8 *pixelShaderProgram,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const c8 *geometryShaderProgram,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData) :
		Driver(driver),
		CallBack(callback), Alpha(false), Blending(false), AlphaTest(false), Program(0), Program2(0), UserData(userData)
{
#ifdef _DEBUG
	setDebugName("COpenGLSLMaterialRenderer");
#endif

	switch (baseMaterial) {
	case EMT_TRANSPARENT_VERTEX_ALPHA:
	case EMT_TRANSPARENT_ALPHA_CHANNEL:
		Alpha = true;
		break;
	case EMT_ONETEXTURE_BLEND:
		Blending = true;
		break;
	case EMT_TRANSPARENT_ALPHA_CHANNEL_REF:
		AlphaTest = true;
		break;
	default:
		break;
	}

	if (CallBack)
		CallBack->grab();

	if (!Driver->queryFeature(EVDF_ARB_GLSL))
		return;

	init(outMaterialTypeNr, vertexShaderProgram, pixelShaderProgram, geometryShaderProgram);
}